

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

void duckdb::DecimalRoundPositivePrecisionFunction<short,duckdb::NumericHelper>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  short sVar2;
  ulong count;
  short *psVar3;
  short *psVar4;
  unsigned_long *puVar5;
  data_ptr_t pdVar6;
  data_ptr_t pdVar7;
  sel_t *psVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  byte bVar11;
  BoundFunctionExpression *pBVar12;
  pointer pFVar13;
  const_reference this_00;
  pointer pEVar14;
  reference vector;
  TemplatedValidityData<unsigned_long> *pTVar15;
  short sVar16;
  ulong uVar17;
  ulong uVar18;
  unsigned_long uVar19;
  idx_t idx_in_entry;
  ulong uVar20;
  short sVar21;
  ulong uVar22;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  pBVar12 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  pFVar13 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar12->bind_info);
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](&pBVar12->children,0);
  pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(this_00);
  bVar11 = DecimalType::GetScale(&pEVar14->return_type);
  sVar2 = *(short *)(NumericHelper::POWERS_OF_TEN +
                    ((ulong)bVar11 - (long)*(int *)&pFVar13[1]._vptr_FunctionData) * 8);
  sVar21 = (short)((uint)(int)(short)(sVar2 - (sVar2 >> 0xf)) >> 1);
  vector = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  count = input->count;
  if (vector->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar7 = result->data;
    pdVar6 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar5 == (unsigned_long *)0x0) {
      if (count != 0) {
        uVar20 = 0;
        do {
          sVar16 = sVar21;
          if (*(short *)(pdVar6 + uVar20 * 2) < 0) {
            sVar16 = -sVar21;
          }
          *(short *)(pdVar7 + uVar20 * 2) =
               (short)(sVar16 + *(short *)(pdVar6 + uVar20 * 2)) / sVar2;
          uVar20 = uVar20 + 1;
        } while (count != uVar20);
      }
    }
    else {
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar5;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if (0x3f < count + 0x3f) {
        puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        uVar18 = 0;
        uVar20 = 0;
        do {
          if (puVar5 == (unsigned_long *)0x0) {
            uVar19 = 0xffffffffffffffff;
          }
          else {
            uVar19 = puVar5[uVar18];
          }
          uVar22 = uVar20 + 0x40;
          if (count <= uVar20 + 0x40) {
            uVar22 = count;
          }
          uVar17 = uVar22;
          if (uVar19 != 0) {
            uVar17 = uVar20;
            if (uVar19 == 0xffffffffffffffff) {
              if (uVar20 < uVar22) {
                do {
                  sVar16 = sVar21;
                  if (*(short *)(pdVar6 + uVar20 * 2) < 0) {
                    sVar16 = -sVar21;
                  }
                  *(short *)(pdVar7 + uVar20 * 2) =
                       (short)(sVar16 + *(short *)(pdVar6 + uVar20 * 2)) / sVar2;
                  uVar20 = uVar20 + 1;
                  uVar17 = uVar20;
                } while (uVar22 != uVar20);
              }
            }
            else if (uVar20 < uVar22) {
              uVar17 = 0;
              do {
                if ((uVar19 >> (uVar17 & 0x3f) & 1) != 0) {
                  sVar16 = sVar21;
                  if (*(short *)(pdVar6 + uVar17 * 2 + uVar20 * 2) < 0) {
                    sVar16 = -sVar21;
                  }
                  *(short *)(pdVar7 + uVar17 * 2 + uVar20 * 2) =
                       (short)(sVar16 + *(short *)(pdVar6 + uVar17 * 2 + uVar20 * 2)) / sVar2;
                }
                uVar17 = uVar17 + 1;
              } while ((uVar20 - uVar22) + uVar17 != 0);
              uVar17 = uVar20 + uVar17;
            }
          }
          uVar18 = uVar18 + 1;
          uVar20 = uVar17;
        } while (uVar18 != count + 0x3f >> 6);
      }
    }
  }
  else if (vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    psVar3 = (short *)result->data;
    psVar4 = (short *)vector->data;
    puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    sVar16 = -sVar21;
    if (-1 < *psVar4) {
      sVar16 = sVar21;
    }
    *psVar3 = (short)(sVar16 + *psVar4) / sVar2;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar7 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar8 = (local_78.sel)->sel_vector;
        uVar20 = 0;
        do {
          uVar18 = uVar20;
          if (psVar8 != (sel_t *)0x0) {
            uVar18 = (ulong)psVar8[uVar20];
          }
          sVar16 = sVar21;
          if (*(short *)(local_78.data + uVar18 * 2) < 0) {
            sVar16 = -sVar21;
          }
          *(short *)(pdVar7 + uVar20 * 2) =
               (short)(sVar16 + *(short *)(local_78.data + uVar18 * 2)) / sVar2;
          uVar20 = uVar20 + 1;
        } while (count != uVar20);
      }
    }
    else if (count != 0) {
      psVar8 = (local_78.sel)->sel_vector;
      uVar20 = 0;
      do {
        uVar18 = uVar20;
        if (psVar8 != (sel_t *)0x0) {
          uVar18 = (ulong)psVar8[uVar20];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar18 >> 6]
             >> (uVar18 & 0x3f) & 1) == 0) {
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_98,&local_80);
            p_Var10 = p_Stack_90;
            peVar9 = local_98;
            local_98 = (element_type *)0x0;
            p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar9;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var10;
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            }
            if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
            }
            pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)
                 (pTVar15->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar11 = (byte)uVar20 & 0x3f;
          puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                   (uVar20 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
        }
        else {
          sVar16 = sVar21;
          if (*(short *)(local_78.data + uVar18 * 2) < 0) {
            sVar16 = -sVar21;
          }
          *(short *)(pdVar7 + uVar20 * 2) =
               (short)(sVar16 + *(short *)(local_78.data + uVar18 * 2)) / sVar2;
        }
        uVar20 = uVar20 + 1;
      } while (count != uVar20);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void DecimalRoundPositivePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	T power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[source_scale - info.target_scale]);
	T addition = power_of_ten / 2;
	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / power_of_ten);
	});
}